

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int find_ref_match_in_above_nbs(int total_mi_cols,MACROBLOCKD *xd)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *mbmi;
  long lVar5;
  long in_RSI;
  int in_EDI;
  int match_found;
  MB_MODE_INFO **above_mi;
  int above_mi_col;
  uint8_t mi_step;
  int end_col;
  MB_MODE_INFO **prev_row_mi;
  MB_MODE_INFO **cur_mbmi;
  int mi_col;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  if ((*(byte *)(in_RSI + 0x1ec0) & 1) == 0) {
    local_4 = 1;
  }
  else {
    iVar4 = *(int *)(in_RSI + 4);
    lVar2 = *(long *)(in_RSI + 0x1eb8);
    lVar5 = (long)iVar4;
    iVar1 = *(int *)(in_RSI + 8);
    if ((int)(iVar4 + (uint)*(byte *)(in_RSI + 0x2074)) < in_EDI) {
      in_EDI = iVar4 + (uint)*(byte *)(in_RSI + 0x2074);
    }
    for (; iVar4 < in_EDI; iVar4 = (in_stack_ffffffffffffffd0 >> 0x18) + iVar4) {
      mbmi = (MB_MODE_INFO *)(lVar2 + lVar5 * -8 + (long)iVar1 * -8 + (long)iVar4 * 8);
      in_stack_ffffffffffffffd0 =
           CONCAT13("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [**(byte **)mbmi],(int3)in_stack_ffffffffffffffd0);
      local_44 = 0;
      iVar3 = is_inter_block(mbmi);
      if (iVar3 != 0) {
        local_44 = ref_match_found_in_nb_blocks
                             ((MB_MODE_INFO *)CONCAT44(in_EDI,in_stack_ffffffffffffffd0),
                              (MB_MODE_INFO *)CONCAT44(iVar4,in_stack_ffffffffffffffc8));
      }
      if (local_44 != 0) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int find_ref_match_in_above_nbs(const int total_mi_cols,
                                              MACROBLOCKD *xd) {
  if (!xd->up_available) return 1;
  const int mi_col = xd->mi_col;
  MB_MODE_INFO **cur_mbmi = xd->mi;
  // prev_row_mi points into the mi array, starting at the beginning of the
  // previous row.
  MB_MODE_INFO **prev_row_mi = xd->mi - mi_col - 1 * xd->mi_stride;
  const int end_col = AOMMIN(mi_col + xd->width, total_mi_cols);
  uint8_t mi_step;
  for (int above_mi_col = mi_col; above_mi_col < end_col;
       above_mi_col += mi_step) {
    MB_MODE_INFO **above_mi = prev_row_mi + above_mi_col;
    mi_step = mi_size_wide[above_mi[0]->bsize];
    int match_found = 0;
    if (is_inter_block(*above_mi))
      match_found = ref_match_found_in_nb_blocks(*cur_mbmi, *above_mi);
    if (match_found) return 1;
  }
  return 0;
}